

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b296a::AssertionEmitter::emitFunction(AssertionEmitter *this,Ref func)

{
  ostream *this_00;
  undefined1 local_48 [8];
  JSPrinter jser;
  AssertionEmitter *this_local;
  Ref func_local;
  
  jser.ast.inst = (Value *)this;
  cashew::JSPrinter::JSPrinter((JSPrinter *)local_48,true,true,func);
  cashew::JSPrinter::printAst((JSPrinter *)local_48);
  this_00 = ::wasm::Output::operator<<(this->out,(char **)&jser);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  cashew::JSPrinter::~JSPrinter((JSPrinter *)local_48);
  return;
}

Assistant:

void emitFunction(Ref func) {
    JSPrinter jser(true, true, func);
    jser.printAst();
    out << jser.buffer << std::endl;
  }